

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall despot::util::tinyxml::TiXmlNode::RemoveChild(TiXmlNode *this,TiXmlNode *removeThis)

{
  TiXmlNode *pTVar1;
  TiXmlNode *pTVar2;
  TiXmlNode **ppTVar3;
  
  if (removeThis->parent == this) {
    pTVar1 = removeThis->prev;
    pTVar2 = removeThis->next;
    ppTVar3 = &pTVar2->prev;
    if (pTVar2 == (TiXmlNode *)0x0) {
      ppTVar3 = &this->lastChild;
    }
    *ppTVar3 = pTVar1;
    ppTVar3 = &pTVar1->next;
    if (pTVar1 == (TiXmlNode *)0x0) {
      ppTVar3 = &this->firstChild;
    }
    *ppTVar3 = pTVar2;
    (*(removeThis->super_TiXmlBase)._vptr_TiXmlBase[1])(removeThis);
    return true;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/util/tinyxml/tinyxml.cpp"
                ,0x11c,"bool despot::util::tinyxml::TiXmlNode::RemoveChild(TiXmlNode *)");
}

Assistant:

bool TiXmlNode::RemoveChild(TiXmlNode* removeThis) {
	if (removeThis->parent != this) {
		assert(0);
		return false;
	}

	if (removeThis->next)
		removeThis->next->prev = removeThis->prev;
	else
		lastChild = removeThis->prev;

	if (removeThis->prev)
		removeThis->prev->next = removeThis->next;
	else
		firstChild = removeThis->next;

	delete removeThis;
	return true;
}